

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::AttachedPart::AttachedPart
          (AttachedPart *this,KUINT8 DetachedIndicator,KUINT16 PartAttachedToID,
          AttachedPartParameterType APPT,EntityType *Type)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AttachedPart_002165f0;
  this->m_ui8DetachedIndicator = DetachedIndicator;
  this->m_ui16PartAttachedToID = PartAttachedToID;
  this->m_ui32APPT = APPT;
  (this->m_AttachedPartType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00216a10;
  KVar1 = Type->m_ui8Domain;
  KVar2 = Type->m_ui16Country;
  KVar3 = Type->m_ui8Category;
  KVar4 = Type->m_ui8SubCategory;
  KVar5 = Type->m_ui8Specific;
  KVar6 = Type->m_ui8Extra;
  (this->m_AttachedPartType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_AttachedPartType).m_ui8Domain = KVar1;
  (this->m_AttachedPartType).m_ui16Country = KVar2;
  (this->m_AttachedPartType).m_ui8Category = KVar3;
  (this->m_AttachedPartType).m_ui8SubCategory = KVar4;
  (this->m_AttachedPartType).m_ui8Specific = KVar5;
  (this->m_AttachedPartType).m_ui8Extra = KVar6;
  (this->super_VariableParameter).m_ui8VarParamType = '\x01';
  return;
}

Assistant:

AttachedPart::AttachedPart( KUINT8 DetachedIndicator, KUINT16 PartAttachedToID, AttachedPartParameterType APPT, const EntityType & Type ) :
    m_ui8DetachedIndicator( DetachedIndicator ),
    m_ui16PartAttachedToID( PartAttachedToID ),
    m_ui32APPT( APPT ),
    m_AttachedPartType( Type )
{
    m_ui8VarParamType = AttachedPartType;
}